

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMem.c
# Opt level: O3

void Hop_ManStopMemory(Hop_Man_t *p)

{
  void **__ptr;
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  pVVar1 = p->vChunks;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      if (pVVar1->pArray[lVar2] != (void *)0x0) {
        free(pVVar1->pArray[lVar2]);
        pVVar1 = p->vChunks;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < pVVar1->nSize);
  }
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
  }
  free(pVVar1);
  pVVar1 = p->vPages;
  __ptr = pVVar1->pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
  }
  free(pVVar1);
  p->pListFree = (Hop_Obj_t *)0x0;
  return;
}

Assistant:

void Hop_ManStopMemory( Hop_Man_t * p )
{
    void * pMemory;
    int i;
    Vec_PtrForEachEntry( void *, p->vChunks, pMemory, i )
        ABC_FREE( pMemory );
    Vec_PtrFree( p->vChunks );
    Vec_PtrFree( p->vPages );
    p->pListFree = NULL;
}